

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int time_season(void)

{
  tm *ptVar1;
  long in_FS_OFFSET;
  tm *time_info;
  time_t time_data;
  int local_14;
  time_t local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  time(&local_10);
  ptVar1 = localtime(&local_10);
  switch(ptVar1->tm_mon) {
  case 0:
  case 1:
  case 0xb:
    local_14 = 3;
    break;
  case 2:
  case 3:
  case 4:
    local_14 = 0;
    break;
  case 5:
  case 6:
  case 7:
    local_14 = 1;
    break;
  case 8:
  case 9:
  case 10:
    local_14 = 2;
    break;
  default:
    local_14 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_14;
}

Assistant:

int time_season()
{
	time_t time_data;
	struct tm *time_info;

	time(&time_data);
	time_info = localtime(&time_data);

	switch(time_info->tm_mon)
	{
		case 11:
		case 0:
		case 1:
			return SEASON_WINTER;
		case 2:
		case 3:
		case 4:
			return SEASON_SPRING;
		case 5:
		case 6:
		case 7:
			return SEASON_SUMMER;
		case 8:
		case 9:
		case 10:
			return SEASON_AUTUMN;
	}
	return SEASON_SPRING; // should never happen
}